

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::GridLocalPolynomial::getNormalization
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GridLocalPolynomial *this
          )

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  double extraout_XMM0_Qa;
  value_type extraout_XMM0_Qa_00;
  int local_3c;
  int j;
  double *v;
  int i;
  allocator<double> local_1a;
  undefined1 local_19;
  GridLocalPolynomial *local_18;
  GridLocalPolynomial *this_local;
  vector<double,_std::allocator<double>_> *norms;
  
  local_19 = 0;
  iVar2 = (this->super_BaseCanonicalGrid).num_outputs;
  local_18 = this;
  this_local = (GridLocalPolynomial *)__return_storage_ptr__;
  ::std::allocator<double>::allocator(&local_1a);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,(long)iVar2,&local_1a
            );
  ::std::allocator<double>::~allocator(&local_1a);
  for (v._0_4_ = 0; iVar2 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points),
      (int)v < iVar2; v._0_4_ = (int)v + 1) {
    StorageSet::getValues(&(this->super_BaseCanonicalGrid).values,(int)v);
    for (local_3c = 0; local_3c < (this->super_BaseCanonicalGrid).num_outputs;
        local_3c = local_3c + 1) {
      pvVar4 = __return_storage_ptr__;
      pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,
                          (long)local_3c);
      dVar1 = *pvVar3;
      iVar2 = (int)pvVar4;
      ::std::abs(iVar2);
      if (dVar1 < extraout_XMM0_Qa) {
        ::std::abs(iVar2);
        pvVar3 = ::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,
                            (long)local_3c);
        *pvVar3 = extraout_XMM0_Qa_00;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> GridLocalPolynomial::getNormalization() const{
    std::vector<double> norms(num_outputs);
    for(int i=0; i<points.getNumIndexes(); i++){
        const double *v = values.getValues(i);
        for(int j=0; j<num_outputs; j++){
            if (norms[j] < std::abs(v[j])) norms[j] = std::abs(v[j]);
        }
    }
    return norms;
}